

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O3

void continuous_dist_test_integrate_pdf<trng::truncated_normal_dist<float>>
               (truncated_normal_dist<float> *d)

{
  int i;
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  value_type vVar5;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  result_type tol;
  vector<float,_std::allocator<float>_> y;
  AssertionHandler catchAssertionHandler;
  undefined4 local_fc;
  vector<float,_std::allocator<float>_> local_f8;
  float local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  float local_bc;
  AssertionHandler local_b8;
  SourceLineInfo local_70;
  ITransientExpression local_60;
  float *local_50;
  char *local_48;
  size_t sStack_40;
  undefined4 *local_38;
  StringRef local_30;
  
  fVar2 = (d->P).Phi_a;
  fVar2 = trng::math::detail::inv_Phi<float>(((d->P).Phi_b - fVar2) * 0.01 + fVar2);
  fVar3 = fVar2 * (d->P).sigma_ + (d->P).mu_;
  fVar2 = (d->P).Phi_a;
  fVar2 = trng::math::detail::inv_Phi<float>(((d->P).Phi_b - fVar2) * 0.99 + fVar2);
  local_d8 = ((fVar2 * (d->P).sigma_ + (d->P).mu_) - fVar3) / 2896.0;
  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  iVar1 = 0;
  uStack_d4 = extraout_XMM0_Db;
  uStack_d0 = extraout_XMM0_Dc;
  uStack_cc = extraout_XMM0_Dd;
  do {
    fVar2 = (d->P).sigma_;
    fVar4 = (((float)iVar1 * local_d8 + fVar3) - (d->P).mu_) / fVar2;
    fVar4 = expf(fVar4 * fVar4 * -0.5);
    local_b8.m_assertionInfo.macroName.m_start._0_4_ =
         (fVar4 * (0.3989423 / fVar2)) / ((d->P).Phi_b - (d->P).Phi_a);
    if (local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&local_f8,
                 (iterator)
                 local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,(float *)&local_b8);
    }
    else {
      *local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_b8.m_assertionInfo.macroName.m_start._0_4_;
      local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0xb51);
  vVar5 = simpson_int<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                     local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                     local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  local_fc = 0x37000701;
  local_60._vptr_ITransientExpression = (_func_int **)0x2a6457;
  local_60.m_isBinaryExpression = true;
  local_60.m_result = false;
  local_60._10_6_ = 0;
  local_70.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_70.line = 0x94;
  Catch::StringRef::StringRef(&local_30,"std::abs(s - result_type(98) / result_type(100)) < tol");
  Catch::AssertionHandler::AssertionHandler
            (&local_b8,(StringRef *)&local_60,&local_70,local_30,Normal);
  local_d8 = ABS(local_d8 * vVar5 + -0.98);
  uStack_d4 = uStack_d4 & 0x7fffffff;
  uStack_d0 = uStack_d0 & 0x7fffffff;
  uStack_cc = uStack_cc & 0x7fffffff;
  local_bc = local_d8;
  Catch::StringRef::StringRef((StringRef *)&local_70,"<");
  local_60.m_result = local_d8 < 7.631025e-06;
  local_60.m_isBinaryExpression = true;
  local_60._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_003182b8;
  local_48 = local_70.file;
  sStack_40 = local_70.line;
  local_38 = &local_fc;
  local_50 = &local_bc;
  Catch::AssertionHandler::handleExpr(&local_b8,&local_60);
  Catch::ITransientExpression::~ITransientExpression(&local_60);
  Catch::AssertionHandler::complete(&local_b8);
  if (local_b8.m_completed == false) {
    (*(local_b8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if (local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void continuous_dist_test_integrate_pdf(const dist &d) {
  using result_type = typename dist::result_type;
  const int samples(static_cast<int>(std::min(
      1024ll * 1024, static_cast<long long>(std::round(
                         1 / std::sqrt(std::numeric_limits<result_type>::epsilon()))))));
  const result_type x_min{d.icdf(result_type(1) / result_type(100))};
  const result_type x_max{d.icdf(result_type(99) / result_type(100))};
  const result_type dx{(x_max - x_min) / samples};
  std::vector<result_type> y;
  for (int i{0}; i <= samples; ++i)
    y.push_back(d.pdf(x_min + i * dx));
  const result_type s{simpson_int(y.begin(), y.end()) * dx};
  const result_type tol{result_type(64) / result_type(samples) / result_type(samples)};
  REQUIRE(std::abs(s - result_type(98) / result_type(100)) < tol);
}